

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O3

int * Llb_MtrFindVarOrder(Llb_Mtr_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  int *piVar5;
  int *__ptr;
  int iVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  size_t __nmemb;
  
  iVar1 = p->nRows;
  __nmemb = (size_t)iVar1;
  piVar5 = (int *)calloc(__nmemb,4);
  __ptr = (int *)calloc(__nmemb,4);
  if (0 < (long)__nmemb) {
    uVar2 = p->nCols;
    sVar7 = 0;
    do {
      piVar5[sVar7] = (int)sVar7;
      uVar8 = uVar2;
      uVar9 = (ulong)uVar2;
      do {
        uVar9 = uVar9 - 1;
        if ((int)uVar8 < 1) goto LAB_007d2bf7;
        uVar8 = uVar8 - 1;
      } while (p->pMatrix[uVar9][sVar7] == '\0');
      __ptr[sVar7] = uVar8;
LAB_007d2bf7:
      sVar7 = sVar7 + 1;
    } while (sVar7 != __nmemb);
  }
  do {
    if (iVar1 < 2) {
      if (__ptr == (int *)0x0) {
        return piVar5;
      }
      break;
    }
    iVar6 = *__ptr;
    uVar9 = 0;
    bVar4 = false;
    do {
      iVar3 = __ptr[uVar9 + 1];
      if (iVar3 < iVar6) {
        *(ulong *)(piVar5 + uVar9) =
             CONCAT44((int)*(undefined8 *)(piVar5 + uVar9),
                      (int)((ulong)*(undefined8 *)(piVar5 + uVar9) >> 0x20));
        __ptr[uVar9] = iVar3;
        __ptr[uVar9 + 1] = iVar6;
        bVar4 = true;
        iVar3 = iVar6;
      }
      iVar6 = iVar3;
      uVar9 = uVar9 + 1;
    } while (iVar1 - 1 != uVar9);
  } while (bVar4);
  free(__ptr);
  return piVar5;
}

Assistant:

int * Llb_MtrFindVarOrder( Llb_Mtr_t * p )
{
    int * pOrder, * pLast;
    int i, k, fChanges, Temp;
    pOrder = ABC_CALLOC( int, p->nRows );
    pLast  = ABC_CALLOC( int, p->nRows );
    for ( i = 0; i < p->nRows; i++ )
    {
        pOrder[i] = i;
        for ( k = p->nCols - 1; k >= 0; k-- )
            if ( p->pMatrix[k][i] )
            {
                pLast[i] = k;
                break;
            }
    }
    do
    {
        fChanges = 0;
        for ( i = 0; i < p->nRows - 1; i++ )
            if ( pLast[i] > pLast[i+1] )
            {
                Temp = pOrder[i];
                pOrder[i] = pOrder[i+1];
                pOrder[i+1] = Temp;

                Temp = pLast[i];
                pLast[i] = pLast[i+1];
                pLast[i+1] = Temp;

                fChanges = 1;
            }
    }
    while ( fChanges );
    ABC_FREE( pLast );
    return pOrder;
}